

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O3

void __thiscall BufferedFileWriter::BufferedFileWriter(BufferedFileWriter *this)

{
  condition_variable *this_00;
  
  (this->super_TerminatableThread).m_thread._M_id._M_thread = 0;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedFileWriter_0023d108;
  (this->m_lastErrorStr)._M_dataplus._M_p = (pointer)&(this->m_lastErrorStr).field_2;
  (this->m_lastErrorStr)._M_string_length = 0;
  (this->m_lastErrorStr).field_2._M_local_buf[0] = '\0';
  this->m_terminated = false;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.
  _vptr_SafeQueue = (_func_int **)&PTR__SafeQueue_0023d1b8;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.m_mtx
  .super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_mtx.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_mtx.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.m_mtx
  .super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(__pthread_internal_list **)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_mtx.super___mutex_base._M_mutex.__data.__list + 8) =
       (__pthread_internal_list *)0x0;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.
  m_queue.c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  *(size_t *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 8) = 0;
  ((iterator *)
  ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
          super_SafeQueue<WriterData>.m_queue.c.
          super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x10))->_M_cur =
       (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x18) =
       (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x20) =
       (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x28) =
       (_Map_pointer)0x0;
  ((iterator *)
  ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
          super_SafeQueue<WriterData>.m_queue.c.
          super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x30))->_M_cur =
       (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x38) =
       (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x40) =
       (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
           super_SafeQueue<WriterData>.m_queue.c.
           super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl + 0x48) =
       (_Map_pointer)0x0;
  std::_Deque_base<WriterData,_std::allocator<WriterData>_>::_M_initialize_map
            ((_Deque_base<WriterData,_std::allocator<WriterData>_> *)
             &(this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.
              super_SafeQueue<WriterData>.m_queue,0);
  this_00 = &(this->m_writeQueue).m_cond;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.
  m_maxSize = 200;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.m_mtx =
       &(this->m_writeQueue).m_mtx;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.m_cond = this_00;
  (this->m_writeQueue).super_SafeQueueWithNotification<WriterData>.super_SafeQueue<WriterData>.
  _vptr_SafeQueue = (_func_int **)&PTR__WaitableSafeQueue_0023d148;
  (this->m_writeQueue).m_mtx.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_writeQueue).m_mtx.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_writeQueue).m_mtx.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_writeQueue).m_mtx.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_writeQueue).m_mtx.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(this_00);
  this->m_lastErrorCode = 0;
  this->m_nothingToExecute = true;
  TerminatableThread::run(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedFileWriter::BufferedFileWriter() : m_terminated(false), m_writeQueue(WRITE_QUEUE_MAX_SIZE)
{
    m_lastErrorCode = 0;
    m_nothingToExecute = true;
    run(this);
}